

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

fdb_status btreeblk_operation_end(void *voidhandle)

{
  btreeblk_block *pbVar1;
  btreeblk_handle *in_RDI;
  fdb_status status;
  int writable;
  btreeblk_block *block;
  list_elem *e;
  btreeblk_handle *handle;
  btreeblk_block *in_stack_ffffffffffffffb8;
  btreeblk_handle *in_stack_ffffffffffffffc0;
  fdb_status fVar2;
  int in_stack_ffffffffffffffd4;
  avl_node *paVar3;
  
  fVar2 = FDB_RESULT_SUCCESS;
  pbVar1 = (btreeblk_block *)list_begin(&in_RDI->alc_list);
  while( true ) {
    if (pbVar1 == (btreeblk_block *)0x0) {
      pbVar1 = (btreeblk_block *)list_begin(&in_RDI->read_list);
      do {
        if (pbVar1 == (btreeblk_block *)0x0) {
          return fVar2;
        }
        paVar3 = &pbVar1[-1].avl;
        if (*(char *)&pbVar1[-1].avl.right != '\0') {
          fVar2 = _btreeblk_write_dirty_block(in_RDI,pbVar1);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            return fVar2;
          }
          *(undefined1 *)&paVar3->right = 0;
          fVar2 = FDB_RESULT_SUCCESS;
        }
        if (*(byte *)((long)&paVar3->right + 1) < 8) {
          *(char *)((long)&paVar3->right + 1) = *(char *)((long)&paVar3->right + 1) + '\x01';
          pbVar1 = (btreeblk_block *)list_next((list_elem *)pbVar1);
        }
        else {
          pbVar1 = (btreeblk_block *)
                   list_remove(&in_RDI->read_list,(list_elem *)((long)(paVar3 + 1) + 8));
          _btreeblk_free_dirty_block(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        }
      } while( true );
    }
    paVar3 = &pbVar1[-1].avl;
    in_stack_ffffffffffffffd4 =
         filemgr_is_writable((filemgr *)paVar3,CONCAT44(in_stack_ffffffffffffffd4,fVar2));
    if (in_stack_ffffffffffffffd4 == 0) {
      fdb_log_impl((err_log_callback *)0x0,1,FDB_RESULT_WRITE_FAIL,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/btreeblock.cc"
                   ,"btreeblk_operation_end",0x38a,"b+tree node write fail, BID %zu, file %s",
                   paVar3->parent,in_RDI->file->filename);
      return FDB_RESULT_WRITE_FAIL;
    }
    fVar2 = _btreeblk_write_dirty_block(in_RDI,pbVar1);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    if ((in_RDI->file->blocksize < *(int *)((long)&paVar3->left + 4) + in_RDI->nodesize) ||
       (in_stack_ffffffffffffffd4 == 0)) {
      pbVar1 = (btreeblk_block *)
               list_remove(&in_RDI->alc_list,(list_elem *)((long)(paVar3 + 1) + 8));
      *(undefined1 *)&paVar3->right = 0;
      list_push_front(&in_RDI->read_list,(list_elem *)((long)(paVar3 + 1) + 8));
    }
    else {
      pbVar1 = (btreeblk_block *)list_next((list_elem *)pbVar1);
    }
  }
  return fVar2;
}

Assistant:

fdb_status btreeblk_operation_end(void *voidhandle)
{
    // flush and write all items in allocation list
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    struct list_elem *e;
    struct btreeblk_block *block;
    int writable;
    fdb_status status = FDB_RESULT_SUCCESS;

    // write and free items in allocation list
    e = list_begin(&handle->alc_list);
    while(e){
        block = _get_entry(e, struct btreeblk_block, le);
        writable = filemgr_is_writable(handle->file, block->bid);
        if (writable) {
            status = _btreeblk_write_dirty_block(handle, block);
            if (status != FDB_RESULT_SUCCESS) {
                return status;
            }
        } else {
            fdb_log(nullptr, FDB_LOG_FATAL,
                    FDB_RESULT_WRITE_FAIL,
                    "b+tree node write fail, BID %zu, file %s",
                    block->bid,
                    handle->file->filename);
            return FDB_RESULT_WRITE_FAIL;
        }

        if (block->pos + (handle->nodesize) > (handle->file->blocksize) || !writable) {
            // remove from alc_list and insert into read list
            e = list_remove(&handle->alc_list, &block->le);
            block->dirty = 0;
            list_push_front(&handle->read_list, &block->le);
        }else {
            // reserve the block when there is enough space and the block is writable
            e = list_next(e);
        }
    }

    // free items in read list
    // list
    e = list_begin(&handle->read_list);
    while(e){
        block = _get_entry(e, struct btreeblk_block, le);

        if (block->dirty) {
            // write back only when the block is modified
            status = _btreeblk_write_dirty_block(handle, block);
            if (status != FDB_RESULT_SUCCESS) {
                return status;
            }
            block->dirty = 0;
        }

        if (block->age >= BTREEBLK_AGE_LIMIT) {
            e = list_remove(&handle->read_list, &block->le);
            _btreeblk_free_dirty_block(handle, block);
        } else {
            block->age++;
            e = list_next(e);
        }
    }

    return status;
}